

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_name(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlChar *local_60;
  xmlNsPtr ns;
  xmlAttrPtr attr;
  xmlDocPtr doc;
  xmlChar *res;
  xmlNodePtr cur;
  PyObject *obj;
  PyObject *resultobj;
  PyObject *args_local;
  PyObject *self_local;
  
  resultobj = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:name",&cur);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (cur == (xmlNodePtr)&_Py_NoneStruct) {
      local_60 = (xmlChar *)0x0;
    }
    else {
      local_60 = cur->name;
    }
    switch(*(undefined4 *)(local_60 + 8)) {
    case 2:
      doc = *(xmlDocPtr *)(local_60 + 0x10);
      break;
    default:
      doc = *(xmlDocPtr *)(local_60 + 0x10);
      break;
    case 9:
    case 0xd:
      doc = *(xmlDocPtr *)(local_60 + 0x88);
      break;
    case 0x12:
      doc = *(xmlDocPtr *)(local_60 + 0x18);
    }
    self_local = libxml_constxmlCharPtrWrap((xmlChar *)doc);
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_name(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *resultobj, *obj;
    xmlNodePtr cur;
    const xmlChar *res;

    if (!PyArg_ParseTuple(args, (char *) "O:name", &obj))
        return NULL;
    cur = PyxmlNode_Get(obj);

    switch (cur->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:{
                xmlDocPtr doc = (xmlDocPtr) cur;

                res = doc->URL;
                break;
            }
        case XML_ATTRIBUTE_NODE:{
                xmlAttrPtr attr = (xmlAttrPtr) cur;

                res = attr->name;
                break;
            }
        case XML_NAMESPACE_DECL:{
                xmlNsPtr ns = (xmlNsPtr) cur;

                res = ns->prefix;
                break;
            }
        default:
            res = cur->name;
            break;
    }
    resultobj = libxml_constxmlCharPtrWrap(res);

    return resultobj;
}